

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_run_container_andnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  int iVar5;
  bitset_container_t *bitset;
  ulong uVar6;
  array_container_t *paVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  
  bitset = bitset_container_create();
  bitset->cardinality = src_1->cardinality;
  memcpy(bitset->words,src_1->words,0x2000);
  iVar5 = src_2->n_runs;
  if (0 < (long)iVar5) {
    prVar3 = src_2->runs;
    puVar4 = bitset->words;
    lVar9 = 0;
    do {
      uVar1 = prVar3[lVar9].value;
      uVar2 = prVar3[lVar9].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar12 = (uint)uVar2 + (uint)uVar1;
        uVar8 = (uint)(uVar1 >> 6);
        uVar6 = -1L << ((byte)uVar1 & 0x3f);
        uVar10 = uVar12 >> 6;
        bVar11 = (byte)uVar12;
        if (uVar10 - uVar8 == 0) {
          bVar11 = ~bVar11;
          uVar6 = (uVar6 << (bVar11 & 0x3f)) >> (bVar11 & 0x3f);
          uVar10 = uVar8;
        }
        else {
          puVar4[uVar8] = puVar4[uVar8] & ~uVar6;
          if (uVar8 + 1 < uVar10) {
            memset(puVar4 + (ulong)(uVar1 >> 6) + 1,0,(ulong)((uVar10 - uVar8) - 2) * 8 + 8);
          }
          uVar6 = 0xffffffffffffffff >> (~bVar11 & 0x3f);
        }
        puVar4[uVar10] = puVar4[uVar10] & ~uVar6;
      }
      lVar9 = lVar9 + 1;
    } while (iVar5 != lVar9);
  }
  iVar5 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar5;
  if (iVar5 < 0x1001) {
    paVar7 = array_container_from_bitset(bitset);
    *dst = paVar7;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar5;
}

Assistant:

bool bitset_run_container_andnot(
    const bitset_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    // follows Java implementation
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_1, result);
    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(result->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}